

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

int av1_intrabc_hash_search
              (AV1_COMP *cpi,MACROBLOCKD *xd,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
              IntraBCHashInfo *intrabc_hash_info,FULLPEL_MV *best_mv)

{
  BLOCK_SIZE BVar1;
  MV_COST_TYPE MVar2;
  ushort uVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  buf_2d *pbVar7;
  SequenceHeader *pSVar8;
  buf_2d *pbVar9;
  MV *pMVar10;
  ushort uVar11;
  short sVar12;
  int32_t iVar13;
  int iVar14;
  ushort *puVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  Iterator iterator;
  uint32_t hash_value2;
  uint32_t hash_value1;
  Iterator local_b0;
  FULLPEL_MOTION_SEARCH_PARAMS *local_a0;
  ulong local_98;
  hash_table *local_90;
  uint local_88;
  int local_84;
  int local_80;
  int local_7c;
  uint32_t local_78;
  uint32_t local_74;
  ulong local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  FULLPEL_MV *local_48;
  uint local_38;
  uint local_34;
  
  iVar27 = 0x7fffffff;
  if ((((cpi->common).features.allow_screen_content_tools == true) &&
      ((cpi->common).features.allow_intrabc == true)) &&
     (((cpi->common).current_frame.frame_type & 0xfd) == 0)) {
    BVar1 = ms_params->bsize;
    bVar16 = block_size_wide[BVar1];
    local_98 = (ulong)bVar16;
    if (bVar16 == block_size_high[BVar1]) {
      pbVar7 = (ms_params->ms_buffers).src;
      local_70 = (ulong)(uint)xd->mi_row;
      iVar17 = xd->mi_col;
      local_a0 = ms_params;
      local_48 = best_mv;
      av1_get_block_hash_value
                (intrabc_hash_info,pbVar7->buf,pbVar7->stride,(uint)bVar16,&local_74,&local_78,
                 (uint)xd->cur_buf->flags >> 3 & 1);
      local_90 = &intrabc_hash_info->intrabc_hash_table;
      iVar13 = av1_hash_table_count(&intrabc_hash_info->intrabc_hash_table,local_74);
      iVar27 = 0x7fffffff;
      if (1 < iVar13) {
        local_80 = iVar17 * 4;
        iVar27 = (int)local_70;
        local_7c = iVar27 * 4;
        local_b0 = av1_hash_get_first_iterator(local_90,local_74);
        local_90 = (hash_table *)CONCAT44(local_90._4_4_,iVar27 << 5);
        local_84 = iVar17 << 5;
        local_98 = (ulong)(uint)((int)local_98 << 3);
        local_58 = 0x10003L >> (BVar1 & 0x3f);
        local_60 = 0x20005L >> (BVar1 & 0x3f);
        local_50 = (ulong)((iVar17 >> 4) - 4);
        iVar27 = 0x7fffffff;
        do {
          puVar15 = (ushort *)aom_iterator_get(&local_b0);
          if (local_78 == *(uint32_t *)(puVar15 + 2)) {
            uVar18 = (uint)puVar15[1] - local_7c;
            iVar17 = ((int)(uVar18 * 0x80000) >> 0x10) + (int)local_90;
            iVar24 = (xd->tile).mi_row_start * 0x20;
            if (iVar24 <= iVar17) {
              iVar28 = (uint)*puVar15 - local_80;
              iVar25 = (iVar28 * 0x80000 >> 0x10) + local_84;
              uVar5 = (xd->tile).mi_col_start;
              iVar26 = uVar5 * 0x20;
              if (iVar26 <= iVar25) {
                iVar14 = iVar17 + (int)local_98;
                if (iVar14 <= (xd->tile).mi_row_end * 0x20) {
                  iVar19 = (int)local_98 + iVar25;
                  iVar6 = (xd->tile).mi_col_end;
                  if (iVar19 <= iVar6 * 0x20) {
                    pSVar8 = (cpi->common).seq_params;
                    if (((xd->is_chroma_ref != true) || (pSVar8->monochrome != '\0')) ||
                       ((((local_58 & 1) == 0 ||
                         ((xd->plane[1].subsampling_x == 0 || (iVar26 + 0x20 <= iVar25)))) &&
                        (((local_60 & 1) == 0 ||
                         ((xd->plane[1].subsampling_y == 0 || (iVar24 + 0x20 <= iVar17)))))))) {
                      bVar16 = (byte)pSVar8->mib_size_log2;
                      iVar24 = (int)local_70 >> (bVar16 & 0x1f);
                      iVar25 = 4 << (bVar16 & 0x1f);
                      iVar17 = ((iVar14 >> 3) + -1) / iVar25;
                      if (iVar17 <= iVar24) {
                        iVar26 = (iVar19 >> 3) + -1 >> 6;
                        iVar14 = ((int)(iVar6 + ~uVar5) >> 4) + 1;
                        if ((iVar17 * iVar14 + iVar26 < iVar24 * iVar14 + (int)local_50) &&
                           (iVar26 < (int)((iVar24 - iVar17) * ((0x40 < iVar25) + 5) + (int)local_50
                                          ))) {
                          iVar17 = (int)(short)iVar28;
                          if (((local_a0->mv_limits).col_min <= iVar17) &&
                             (iVar17 <= (local_a0->mv_limits).col_max)) {
                            iVar24 = (int)(short)uVar18;
                            if (((local_a0->mv_limits).row_min <= iVar24) &&
                               (iVar24 <= (local_a0->mv_limits).row_max)) {
                              pbVar7 = (local_a0->ms_buffers).src;
                              pbVar9 = (local_a0->ms_buffers).ref;
                              iVar25 = pbVar9->stride;
                              local_38 = (*local_a0->vfp->vf)
                                                   (pbVar7->buf,pbVar7->stride,
                                                    pbVar9->buf + (iVar24 * iVar25 + iVar17),iVar25,
                                                    &local_34);
                              MVar2 = (local_a0->mv_cost_params).mv_cost_type;
                              iVar17 = 0;
                              if (MVar2 != '\x04') {
                                uVar11 = (short)uVar18 * 8;
                                sVar12 = (short)iVar28 * 8;
                                pMVar10 = (local_a0->mv_cost_params).ref_mv;
                                uVar3 = pMVar10->row;
                                sVar4 = pMVar10->col;
                                local_88 = (uint)uVar3;
                                sVar20 = uVar11 - uVar3;
                                sVar22 = sVar12 - sVar4;
                                sVar21 = -sVar20;
                                if (0 < sVar20) {
                                  sVar21 = sVar20;
                                }
                                sVar23 = -sVar22;
                                if (0 < sVar22) {
                                  sVar23 = sVar22;
                                }
                                if (MVar2 == '\x03') {
                                  iVar17 = (int)sVar23 + (int)sVar21 >> 3;
                                }
                                else if (MVar2 == '\x01') {
                                  iVar17 = (int)sVar23 + (int)sVar21 >> 2;
                                }
                                else if (MVar2 == '\0') {
                                  local_68 = (long)(local_a0->mv_cost_params).error_per_bit;
                                  iVar17 = (int)(((long)(local_a0->mv_cost_params).mvcost[1][sVar22]
                                                  + (long)(local_a0->mv_cost_params).mvcost[0]
                                                          [sVar20] +
                                                 (long)*(int *)((long)(local_a0->mv_cost_params).
                                                                      mvjcost +
                                                               (ulong)((uint)(sVar12 != sVar4) * 4 +
                                                                      (uint)(uVar11 != uVar3) * 8)))
                                                 * local_68 + 0x2000U >> 0xe);
                                }
                              }
                              if ((int)(iVar17 + local_38) < iVar27) {
                                *local_48 = (FULLPEL_MV)(uVar18 & 0xffff | iVar28 * 0x10000);
                                iVar27 = iVar17 + local_38;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          aom_iterator_increment(&local_b0);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
    }
  }
  return iVar27;
}

Assistant:

int av1_intrabc_hash_search(const AV1_COMP *cpi, const MACROBLOCKD *xd,
                            const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                            IntraBCHashInfo *intrabc_hash_info,
                            FULLPEL_MV *best_mv) {
  if (!av1_use_hash_me(cpi)) return INT_MAX;

  const BLOCK_SIZE bsize = ms_params->bsize;
  const int block_width = block_size_wide[bsize];
  const int block_height = block_size_high[bsize];

  if (block_width != block_height) return INT_MAX;

  const FullMvLimits *mv_limits = &ms_params->mv_limits;
  const MSBuffers *ms_buffer = &ms_params->ms_buffers;

  const uint8_t *src = ms_buffer->src->buf;
  const int src_stride = ms_buffer->src->stride;

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int x_pos = mi_col * MI_SIZE;
  const int y_pos = mi_row * MI_SIZE;

  uint32_t hash_value1, hash_value2;
  int best_hash_cost = INT_MAX;

  // for the hashMap
  hash_table *ref_frame_hash = &intrabc_hash_info->intrabc_hash_table;

  av1_get_block_hash_value(intrabc_hash_info, src, src_stride, block_width,
                           &hash_value1, &hash_value2, is_cur_buf_hbd(xd));

  const int count = av1_hash_table_count(ref_frame_hash, hash_value1);
  if (count <= 1) {
    return INT_MAX;
  }

  Iterator iterator = av1_hash_get_first_iterator(ref_frame_hash, hash_value1);
  for (int i = 0; i < count; i++, aom_iterator_increment(&iterator)) {
    block_hash ref_block_hash = *(block_hash *)(aom_iterator_get(&iterator));
    if (hash_value2 == ref_block_hash.hash_value2) {
      // Make sure the prediction is from valid area.
      const MV dv = { GET_MV_SUBPEL(ref_block_hash.y - y_pos),
                      GET_MV_SUBPEL(ref_block_hash.x - x_pos) };
      if (!av1_is_dv_valid(dv, &cpi->common, xd, mi_row, mi_col, bsize,
                           cpi->common.seq_params->mib_size_log2))
        continue;

      FULLPEL_MV hash_mv;
      hash_mv.col = ref_block_hash.x - x_pos;
      hash_mv.row = ref_block_hash.y - y_pos;
      if (!av1_is_fullmv_in_range(mv_limits, hash_mv)) continue;
      FULLPEL_MV_STATS mv_stats;
      const int refCost = get_mvpred_var_cost(ms_params, &hash_mv, &mv_stats);
      if (refCost < best_hash_cost) {
        best_hash_cost = refCost;
        *best_mv = hash_mv;
      }
    }
  }

  return best_hash_cost;
}